

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O2

void DupWhileImplementation(bool isWhile)

{
  bool bVar1;
  int iVar2;
  CStringsList *pCVar3;
  size_t sVar4;
  _Elt_pointer pSVar5;
  char *stringSource;
  char *pcVar6;
  aint val;
  char *expressionSource;
  CStringsList *condition;
  char *guardianSource;
  
  val = 0;
  condition = (CStringsList *)0x0;
  if (RepeatStack.c.super__Deque_base<SRepeatStack,_std::allocator<SRepeatStack>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur !=
      RepeatStack.c.super__Deque_base<SRepeatStack,_std::allocator<SRepeatStack>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    pSVar5 = RepeatStack.c.super__Deque_base<SRepeatStack,_std::allocator<SRepeatStack>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (RepeatStack.c.super__Deque_base<SRepeatStack,_std::allocator<SRepeatStack>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        RepeatStack.c.super__Deque_base<SRepeatStack,_std::allocator<SRepeatStack>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      pSVar5 = RepeatStack.c.super__Deque_base<SRepeatStack,_std::allocator<SRepeatStack>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 8;
    }
    if (pSVar5[-1].IsInWork == false) {
      SkipToEol(&lp);
      pSVar5[-1].Level = pSVar5[-1].Level + 1;
      return;
    }
  }
  if (isWhile) {
    pCVar3 = (CStringsList *)operator_new(0x28);
    CStringsList::CStringsList(pCVar3,lp,(CStringsList *)0x0);
    pcVar6 = pCVar3->string;
    condition = pCVar3;
    sVar4 = strlen(pcVar6);
    lp = lp + sVar4;
    expressionSource = pcVar6;
    iVar2 = ParseExpressionNoSyntaxError(&expressionSource,&val);
    if (iVar2 == 0) {
      val = 0x186a1;
LAB_00110a56:
      Error("[WHILE] Syntax error in <expression>",pCVar3->string,SUPPRESS);
      free(pCVar3->string);
      pcVar6 = strdup("0");
      pCVar3->string = pcVar6;
      val = 1;
    }
    else if ((*expressionSource == '\0') || (bVar1 = comma(&expressionSource), !bVar1)) {
      val = 0x186a1;
    }
    else {
      guardianSource = expressionSource;
      iVar2 = ParseExpressionNoSyntaxError(&guardianSource,&val);
      if (iVar2 == 0) goto LAB_00110a56;
      if (expressionSource[-1] != ',') {
        __assert_fail("\',\' == expressionSource[-1]",
                      "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/directives.cpp"
                      ,0x74c,"void DupWhileImplementation(bool)");
      }
      expressionSource[-1] = '\0';
      val = val + 1;
    }
    goto LAB_00110a87;
  }
  IsLabelNotFound = false;
  iVar2 = ParseExpressionNoSyntaxError(&lp,&val);
  if (iVar2 == 0) {
    pcVar6 = "[DUP/REPT] Syntax error in <count>";
    goto LAB_00110ae4;
  }
  if (IsLabelNotFound == true) {
    Error("[DUP/REPT] Forward reference",(char *)0x0,ALL);
  }
  if (val < 0) {
    ErrorInt("[DUP/REPT] Repeat value must be positive or zero",val,IF_FIRST);
    return;
  }
  bVar1 = comma(&lp);
  if (bVar1) {
    pcVar6 = GetID(&lp);
    if (pcVar6 == (char *)0x0) {
      Error("[DUP/REPT] invalid index variable name",lp,IF_FIRST);
      SkipToEol(&lp);
      goto LAB_00110a87;
    }
  }
  else {
LAB_00110a87:
    pcVar6 = (char *)0x0;
  }
  pCVar3 = (CStringsList *)operator_new(0x28);
  stringSource = "";
  if (pcVar6 != (char *)0x0) {
    stringSource = pcVar6;
  }
  CStringsList::CStringsList(pCVar3,stringSource,(CStringsList *)0x0);
  expressionSource = (char *)pCVar3;
  std::deque<SRepeatStack,std::allocator<SRepeatStack>>::
  emplace_back<int&,CStringsList*&,CStringsList*>
            ((deque<SRepeatStack,std::allocator<SRepeatStack>> *)&RepeatStack,&val,&condition,
             (CStringsList **)&expressionSource);
  iVar2 = SkipBlanks();
  if (iVar2 != 0) {
    return;
  }
  pcVar6 = "[DUP] unexpected chars";
LAB_00110ae4:
  Error(pcVar6,lp,SUPPRESS);
  return;
}

Assistant:

static void DupWhileImplementation(bool isWhile) {
	aint val = 0;
	CStringsList* condition = nullptr;

	if (!RepeatStack.empty()) {
		SRepeatStack& dup = RepeatStack.top();
		if (!dup.IsInWork) {
			SkipToEol(lp);		// Just skip the expression to the end of line, don't evaluate yet
			++dup.Level;
			return;
		}
	}

	const char* indexVar = nullptr;
	if (isWhile) {
		condition = new CStringsList(lp);
		if (nullptr == condition) ErrorOOM();
		lp += strlen(condition->string);
		// scan condition string for extra guardian value, and split + parse it as needed
		char* expressionSource = condition->string;
		bool parseOk = ParseExpressionNoSyntaxError(expressionSource, val);
		if (parseOk && *expressionSource && comma(expressionSource)) {
			// comma found, try to parse explicit guardian value
			char* guardianSource = expressionSource;
			parseOk = parseOk && ParseExpressionNoSyntaxError(guardianSource, val);
			// overwrite the comma to keep only condition string without guardian argument
			if (parseOk) {
				assert(',' == expressionSource[-1]);
				expressionSource[-1] = 0;
				++val;		// +1 to explicit value to report error when WHILE does *over* that
			}
		} else {
			val = 100001;	// default guardian value is 100k
		}
		if (!parseOk) {
			Error("[WHILE] Syntax error in <expression>", condition->string, SUPPRESS);
			free(condition->string);			// release original string
			condition->string = STRDUP("0");	// force it to evaluate to zero
			val = 1;
		}
	} else {
		IsLabelNotFound = false;
		if (!ParseExpressionNoSyntaxError(lp, val)) {
			Error("[DUP/REPT] Syntax error in <count>", lp, SUPPRESS);
			return;
		}
		if (IsLabelNotFound) {
			Error("[DUP/REPT] Forward reference", NULL, ALL);
		}
		if ((int) val < 0) {
			ErrorInt("[DUP/REPT] Repeat value must be positive or zero", val, IF_FIRST); return;
		}
		if (comma(lp)) {
			indexVar = GetID(lp);
			if (nullptr == indexVar) {
				Error("[DUP/REPT] invalid index variable name", lp, IF_FIRST);
				SkipToEol(lp);
			}
		}
	}

	RepeatStack.emplace(val, condition, new CStringsList(indexVar ? indexVar : ""));
	if (!SkipBlanks()) Error("[DUP] unexpected chars", lp, SUPPRESS);
}